

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xform.cpp
# Opt level: O0

ON_Interval ApproxSpectrumLTL(ON_Xform *L)

{
  ON_Interval OVar1;
  ON_Xform local_128;
  undefined1 auStack_a8 [8];
  ON_Xform LTL;
  ON_Xform *L_local;
  
  LTL.m_xform[3][1] = L->m_xform[3][2];
  LTL.m_xform[3][2] = L->m_xform[3][3];
  LTL.m_xform[2][3] = L->m_xform[3][0];
  LTL.m_xform[3][0] = L->m_xform[3][1];
  LTL.m_xform[2][1] = L->m_xform[2][2];
  LTL.m_xform[2][2] = L->m_xform[2][3];
  LTL.m_xform[1][3] = L->m_xform[2][0];
  LTL.m_xform[2][0] = L->m_xform[2][1];
  auStack_a8 = (undefined1  [8])L->m_xform[0][0];
  LTL.m_xform[0][0] = L->m_xform[0][1];
  LTL.m_xform[0][1] = L->m_xform[0][2];
  LTL.m_xform[0][2] = L->m_xform[0][3];
  LTL.m_xform[0][3] = L->m_xform[1][0];
  LTL.m_xform[1][0] = L->m_xform[1][1];
  LTL.m_xform[1][1] = L->m_xform[1][2];
  LTL.m_xform[1][2] = L->m_xform[1][3];
  ON_Xform::Transpose((ON_Xform *)auStack_a8);
  ON_Xform::operator*(&local_128,(ON_Xform *)auStack_a8,L);
  LTL.m_xform[3][1] = local_128.m_xform[3][2];
  LTL.m_xform[3][2] = local_128.m_xform[3][3];
  LTL.m_xform[2][3] = local_128.m_xform[3][0];
  LTL.m_xform[3][0] = local_128.m_xform[3][1];
  LTL.m_xform[2][1] = local_128.m_xform[2][2];
  LTL.m_xform[2][2] = local_128.m_xform[2][3];
  LTL.m_xform[1][3] = local_128.m_xform[2][0];
  LTL.m_xform[2][0] = local_128.m_xform[2][1];
  LTL.m_xform[1][1] = local_128.m_xform[1][2];
  LTL.m_xform[1][2] = local_128.m_xform[1][3];
  LTL.m_xform[0][3] = local_128.m_xform[1][0];
  LTL.m_xform[1][0] = local_128.m_xform[1][1];
  LTL.m_xform[0][1] = local_128.m_xform[0][2];
  LTL.m_xform[0][2] = local_128.m_xform[0][3];
  auStack_a8 = (undefined1  [8])local_128.m_xform[0][0];
  LTL.m_xform[0][0] = local_128.m_xform[0][1];
  OVar1 = BoundEVals((ON_Xform *)auStack_a8);
  return (ON_Interval)OVar1.m_t;
}

Assistant:

static ON_Interval ApproxSpectrumLTL(const ON_Xform& L)
{
	// L.IsLinear() is a precondition

	// LTL = L^T * L
	ON_Xform LTL = L;
	LTL.Transpose();
	LTL = LTL * L;

	return  BoundEVals(LTL);
}